

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  pointer *ppVVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  RenderTarget *pRVar7;
  bool bVar8;
  bool bVar9;
  int i;
  GLuint GVar10;
  long lVar11;
  ostream *poVar12;
  GLuint *buffers;
  undefined7 in_register_00000009;
  ulong uVar13;
  int iVar14;
  bool *compile_error;
  uint width;
  char *pcVar15;
  uint height;
  ulong uVar16;
  int i_1;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  allocator_type local_219;
  GLuint *local_218;
  GLuint *local_210;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar11 = 0;
  do {
    *(uint *)((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar11 * 4) =
         num_groups->m_data[lVar11] * param_1->m_data[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_OES_shader_image_atomic");
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &data.
                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "\n#extension GL_OES_shader_image_atomic : enable",0x2f);
  }
  ppVVar1 = &data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppVVar1,"\nlayout(local_size_x = ",0x17);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)ppVVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", local_size_y = ",0x11);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", local_size_z = ",0x11);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") in;\nlayout(r32ui, binding=0) coherent uniform mediump uimage2D g_image1;\nlayout(r32ui, binding=1) uniform mediump uimage2D g_image2;\nconst uvec3 kGlobalSize = uvec3("
             ,0xa7);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ");\nvoid main() {\n  if (gl_GlobalInvocationID.x >= kGlobalSize.x || gl_GlobalInvocationID.y >= kGlobalSize.y) return;\n  uvec4 color = uvec4(gl_GlobalInvocationID.x + gl_GlobalInvocationID.y);"
             ,0xbe);
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_OES_shader_image_atomic");
  if (bVar9) {
    anon_unknown_0::Output("Using imageAtomicAdd");
    lVar11 = 0xfd;
    pcVar15 = 
    "\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), uvec4(0));\n  imageAtomicAdd(g_image1, ivec2(gl_GlobalInvocationID), color.x);\n  uvec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
    ;
  }
  else {
    anon_unknown_0::Output("Function imageAtomicAdd not supported, using imageStore");
    lVar11 = 0xb7;
    pcVar15 = 
    "\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), color);\n  uvec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppVVar1,pcVar15,lVar11);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  std::ios_base::~ios_base(local_138);
  GVar10 = ComputeShaderBase::CreateComputeProgram
                     (&this->super_ComputeShaderBase,(string *)&display);
  this->m_program = GVar10;
  if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar9 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar9) {
    local_218 = (GLuint *)
                CONCAT44(local_218._4_4_,(int)CONCAT71(in_register_00000009,dispatch_indirect));
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    iVar17 = height * width;
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector(&data,(ulong)(num_groups->m_data[2] * param_1->m_data[2] * iVar17),
           (allocator_type *)&display);
    local_210 = this->m_texture;
    glu::CallLogWrapper::glGenTextures(this_00,2,local_210);
    lVar11 = 0;
    do {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,local_210[lVar11]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8236,width,height);
      glu::CallLogWrapper::glTexSubImage2D
                (this_00,0xde1,0,0,0,width,height,0x8d94,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,*local_210,0,'\0',0,0x88ba,0x8236);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88b9,0x8236);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if ((char)local_218 == '\0') {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    else {
      buffers = &this->m_dispatch_buffer;
      if (this->m_dispatch_buffer == 0) {
        local_218 = buffers;
        glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
        buffers = local_218;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,*buffers);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*local_210);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&display,(long)iVar17,(allocator_type *)&colorData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&colorData,(long)(iVar17 * 4),&local_219);
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,height,0x1908,0x1401,
               colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glDeleteTextures(this_00,2,local_210);
    if (0 < iVar17 * 4) {
      uVar13 = 0;
      do {
        bVar4 = colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13 + 1];
        bVar5 = colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13 + 2];
        bVar6 = colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13 + 3];
        iVar14 = (int)uVar13 >> 2;
        display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar14].m_data[0] =
             (float)colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar13] / 255.0;
        display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar14].m_data[1] = (float)bVar4 / 255.0;
        display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar14].m_data[2] = (float)bVar5 / 255.0;
        display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar14].m_data[3] = (float)bVar6 / 255.0;
        uVar13 = uVar13 + 4;
      } while (uVar13 < (uint)(iVar17 * 4));
    }
    bVar9 = (int)height < 1;
    if (0 < (int)height) {
      fVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data[1];
      local_210 = (GLuint *)CONCAT44(local_210._4_4_,fVar2);
      fVar3 = (this->super_ComputeShaderBase).g_color_eps.m_data[2];
      local_218 = (GLuint *)CONCAT44(local_218._4_4_,fVar3);
      lVar11 = 0;
      uVar13 = 0;
      do {
        if (0 < (int)width) {
          uVar16 = 0;
          do {
            pRVar7 = (this->super_ComputeShaderBase).renderTarget;
            if (((long)uVar13 < (long)pRVar7->m_height) && ((long)uVar16 < (long)pRVar7->m_width)) {
              fVar18 = (float)((int)uVar13 + (int)uVar16) / 255.0;
              iVar17 = (int)lVar11 + (int)uVar16;
              fVar19 = display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_data[0] - fVar18;
              fVar20 = -fVar19;
              if (-fVar19 <= fVar19) {
                fVar20 = fVar19;
              }
              if ((this->super_ComputeShaderBase).g_color_eps.m_data[0] + 0.003921569 < fVar20) {
LAB_00c24dce:
                bVar8 = false;
              }
              else {
                fVar19 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar17].m_data[1] + -1.0;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                if (fVar2 < fVar20) goto LAB_00c24dce;
                fVar19 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar17].m_data[2] + -1.0;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                if (fVar3 < fVar20) goto LAB_00c24dce;
                fVar19 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar17].m_data[3] + -1.0;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                bVar8 = fVar20 <= (this->super_ComputeShaderBase).g_color_eps.m_data[3];
              }
              if (!bVar8) {
                anon_unknown_0::Output
                          ("Got red: %f , expected %f, at (%d, %d)",
                           (double)display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_data[0],
                           (double)fVar18,uVar16 & 0xffffffff,uVar13 & 0xffffffff);
                goto LAB_00c24e65;
              }
            }
            uVar16 = uVar16 + 1;
          } while (width != uVar16);
        }
        uVar13 = uVar13 + 1;
        bVar9 = height <= uVar13;
        lVar11 = lVar11 + (ulong)width;
      } while (uVar13 != height);
    }
LAB_00c24e65:
    if (colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)colorData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)colorData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(display.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (data.
        super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.
                      super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<uvec4> data(kSize);
		glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, kWidth, kHeight);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kWidth, kHeight, GL_RED_INTEGER, GL_UNSIGNED_INT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4>	display(kWidth * kHeight);
		std::vector<GLubyte> colorData(kWidth * kHeight * 4);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
		glDeleteTextures(2, m_texture);

		for (int i = 0; i < kWidth * kHeight * 4; i += 4)
		{
			display[i / 4] =
				vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
					 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
		}

		/* As the colors are converted R8->Rx and then read back as Rx->R8,
		 need to add both conversions to the epsilon. */
		vec4 kColorEps = g_color_eps;
		kColorEps.x() += 1.f / ((1 << 8) - 1.0f);
		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f, 1.0f, 1.0f, 1.0f);
				if (!ColorEqual(display[y * kWidth + x], c, kColorEps))
				{
					Output("Got red: %f , expected %f, at (%d, %d)", display[y * kWidth + x].x(), c.x(), x, y);
					return false;
				}
			}
		}

		return true;
	}